

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-inl.h
# Opt level: O3

void heap_node_swap(heap *heap,heap_node *parent,heap_node *child)

{
  heap_node *phVar1;
  heap_node *phVar2;
  heap_node *phVar3;
  heap_node *phVar4;
  heap_node t;
  
  phVar4 = parent->parent;
  phVar1 = parent->left;
  phVar2 = parent->right;
  phVar3 = child->right;
  parent->left = child->left;
  parent->right = phVar3;
  child->left = phVar1;
  child->right = phVar2;
  child->parent = phVar4;
  parent->parent = child;
  phVar4 = child->left;
  if (phVar4 == child) {
    child->left = parent;
    phVar4 = child->right;
  }
  else {
    child->right = parent;
  }
  if (phVar4 != (heap_node *)0x0) {
    phVar4->parent = child;
  }
  if (parent->left != (heap_node *)0x0) {
    parent->left->parent = parent;
  }
  if (parent->right != (heap_node *)0x0) {
    parent->right->parent = parent;
  }
  phVar4 = child->parent;
  if (phVar4 != (heap_node *)0x0) {
    heap = (heap *)(&phVar4->left + (phVar4->left != parent));
  }
  heap->min = child;
  return;
}

Assistant:

static void heap_node_swap(struct heap* heap,
                           struct heap_node* parent,
                           struct heap_node* child) {
  struct heap_node* sibling;
  struct heap_node t;

  t = *parent;
  *parent = *child;
  *child = t;

  parent->parent = child;
  if (child->left == child) {
    child->left = parent;
    sibling = child->right;
  } else {
    child->right = parent;
    sibling = child->left;
  }
  if (sibling != NULL)
    sibling->parent = child;

  if (parent->left != NULL)
    parent->left->parent = parent;
  if (parent->right != NULL)
    parent->right->parent = parent;

  if (child->parent == NULL)
    heap->min = child;
  else if (child->parent->left == parent)
    child->parent->left = child;
  else
    child->parent->right = child;
}